

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::NewArrayExpression::evalImpl(NewArrayExpression *this,EvalContext *context)

{
  SourceRange range;
  bool bVar1;
  long *plVar2;
  Expression *pEVar3;
  allocator_type *paVar4;
  Type *this_00;
  Type *elements;
  NewArrayExpression *in_RSI;
  ConstantValue *in_RDI;
  optional<long> oVar5;
  ConstantValue def;
  span<slang::ConstantValue,_18446744073709551615UL> elems;
  ConstantValue iv;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> result;
  size_t index;
  size_t count;
  optional<long> size;
  ConstantValue sz;
  ConstantValue *in_stack_fffffffffffffe08;
  EvalContext *in_stack_fffffffffffffe10;
  Type *in_stack_fffffffffffffe18;
  allocator_type *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffe30;
  EvalContext *in_stack_fffffffffffffe58;
  SourceLocation in_stack_fffffffffffffe60;
  SourceLocation in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  DiagCode code;
  span<slang::ConstantValue,_18446744073709551615UL> local_108 [6];
  allocator<slang::ConstantValue> local_a1;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> local_a0;
  allocator_type *local_88;
  allocator_type *local_80;
  SourceLocation local_78;
  SourceLocation SStack_70;
  undefined4 local_64;
  _Storage<long,_true> local_60;
  undefined1 local_58;
  undefined4 local_50;
  
  code = SUB84((ulong)in_stack_fffffffffffffe70 >> 0x20,0);
  sizeExpr(in_RSI);
  Expression::eval((Expression *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x7e5254);
  if (!bVar1) {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_50 = 1;
    goto LAB_007e5727;
  }
  slang::ConstantValue::integer((ConstantValue *)0x7e52b3);
  oVar5 = SVInt::as<long>((SVInt *)in_stack_fffffffffffffe30);
  local_60._M_value =
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_58 = oVar5.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional<long> *)0x7e5306);
  if ((!bVar1) || (plVar2 = std::optional<long>::operator*((optional<long> *)0x7e5319), *plVar2 < 0)
     ) {
    local_64 = 0xc0009;
    pEVar3 = sizeExpr(in_RSI);
    local_78 = (pEVar3->sourceRange).startLoc;
    SStack_70 = (pEVar3->sourceRange).endLoc;
    range.endLoc = in_stack_fffffffffffffe68;
    range.startLoc = in_stack_fffffffffffffe60;
    EvalContext::addDiag(in_stack_fffffffffffffe58,code,range);
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_50 = 1;
    goto LAB_007e5727;
  }
  plVar2 = std::optional<long>::operator*((optional<long> *)0x7e53d2);
  local_80 = (allocator_type *)*plVar2;
  local_88 = (allocator_type *)0x0;
  std::allocator<slang::ConstantValue>::allocator((allocator<slang::ConstantValue> *)0x7e5408);
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
            (in_stack_fffffffffffffe30,CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28)
             ,in_stack_fffffffffffffe20);
  std::allocator<slang::ConstantValue>::~allocator(&local_a1);
  slang::ConstantValue::ConstantValue((ConstantValue *)0x7e543b);
  pEVar3 = initExpr(in_RSI);
  if (pEVar3 == (Expression *)0x0) {
LAB_007e560f:
    this_00 = not_null<const_slang::ast::Type_*>::operator->
                        ((not_null<const_slang::ast::Type_*> *)0x7e5620);
    elements = Type::getArrayElementType(in_stack_fffffffffffffe18);
    Type::getDefaultValue(in_stack_fffffffffffffe18);
    for (; local_88 < local_80; local_88 = local_88 + 1) {
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::operator[]
                (&local_a0,(size_type)local_88);
      slang::ConstantValue::operator=((ConstantValue *)this_00,(ConstantValue *)elements);
    }
    slang::ConstantValue::ConstantValue((ConstantValue *)this_00,(Elements *)elements);
    local_50 = 1;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x7e56ef);
  }
  else {
    initExpr(in_RSI);
    Expression::eval((Expression *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    slang::ConstantValue::operator=
              ((ConstantValue *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x7e54b7);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x7e54c1);
    if (bVar1) {
      local_108[0] = slang::ConstantValue::elements((ConstantValue *)0x7e5540);
      while( true ) {
        bVar1 = false;
        if (local_88 < local_80) {
          in_stack_fffffffffffffe20 = local_88;
          paVar4 = (allocator_type *)
                   std::span<slang::ConstantValue,_18446744073709551615UL>::size
                             ((span<slang::ConstantValue,_18446744073709551615UL> *)0x7e5598);
          bVar1 = in_stack_fffffffffffffe20 < paVar4;
        }
        if (!bVar1) break;
        in_stack_fffffffffffffe18 =
             (Type *)std::span<slang::ConstantValue,_18446744073709551615UL>::operator[]
                               (local_108,(size_type)local_88);
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::operator[]
                  (&local_a0,(size_type)local_88);
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_88 = local_88 + 1;
      }
      goto LAB_007e560f;
    }
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_50 = 1;
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x7e56fc);
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
             in_stack_fffffffffffffe20);
LAB_007e5727:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x7e5734);
  return in_RDI;
}

Assistant:

ConstantValue NewArrayExpression::evalImpl(EvalContext& context) const {
    ConstantValue sz = sizeExpr().eval(context);
    if (!sz)
        return nullptr;

    std::optional<int64_t> size = sz.integer().as<int64_t>();
    if (!size || *size < 0) {
        context.addDiag(diag::InvalidArraySize, sizeExpr().sourceRange) << sz;
        return nullptr;
    }

    size_t count = size_t(*size);
    size_t index = 0;
    std::vector<ConstantValue> result(count);

    ConstantValue iv;
    if (initExpr()) {
        iv = initExpr()->eval(context);
        if (!iv)
            return nullptr;

        auto elems = iv.elements();
        for (; index < count && index < elems.size(); index++)
            result[index] = elems[index];
    }

    // Any remaining elements are default initialized.
    ConstantValue def = type->getArrayElementType()->getDefaultValue();
    for (; index < count; index++)
        result[index] = def;

    return result;
}